

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# family.cc
# Opt level: O3

vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> * __thiscall
prometheus::Family<prometheus::Info>::Collect
          (vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
           *__return_storage_ptr__,Family<prometheus::Info> *this)

{
  int iVar1;
  undefined8 uVar2;
  _Hash_node_base *p_Var3;
  pthread_mutex_t *__mutex;
  initializer_list<prometheus::MetricFamily> __l;
  allocator_type local_129;
  pthread_mutex_t *local_128;
  undefined1 local_120 [32];
  _Alloc_hider local_100;
  size_type sStack_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  MetricType local_e0;
  undefined4 uStack_dc;
  vector<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_> local_d8;
  undefined1 local_c0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  char local_90 [16];
  MetricType local_80;
  undefined4 uStack_7c;
  vector<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_> local_78;
  pointer local_58;
  
  __mutex = (pthread_mutex_t *)&this->mutex_;
  iVar1 = pthread_mutex_lock(__mutex);
  if (iVar1 == 0) {
    if ((this->metrics_)._M_h._M_element_count == 0) {
      (__return_storage_ptr__->
      super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>).
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>).
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    else {
      sStack_f8 = 0;
      local_f0._8_8_ = 0;
      local_120._16_8_ = 0;
      local_120._24_8_ = 0;
      local_120._8_8_ = 0;
      local_100._M_p = (pointer)&local_f0;
      local_f0._M_allocated_capacity = 0;
      local_e0 = Untyped;
      uStack_dc = 0;
      local_d8.
      super__Vector_base<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8.
      super__Vector_base<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d8.
      super__Vector_base<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_128 = __mutex;
      local_120._0_8_ = local_120 + 0x10;
      std::__cxx11::string::_M_assign((string *)local_120);
      std::__cxx11::string::_M_assign((string *)&local_100);
      local_e0 = Info;
      std::vector<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>::reserve
                (&local_d8,(this->metrics_)._M_h._M_element_count);
      p_Var3 = (this->metrics_)._M_h._M_before_begin._M_nxt;
      if (p_Var3 != (_Hash_node_base *)0x0) {
        do {
          CollectMetric((ClientMetric *)local_c0,this,(Labels *)(p_Var3 + 1),
                        (Info *)p_Var3[7]._M_nxt);
          std::vector<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>::
          emplace_back<prometheus::ClientMetric>(&local_d8,(ClientMetric *)local_c0);
          if (local_58 != (pointer)0x0) {
            operator_delete(local_58);
          }
          if ((void *)CONCAT44(uStack_7c,local_80) != (void *)0x0) {
            operator_delete((void *)CONCAT44(uStack_7c,local_80));
          }
          std::
          vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
          ::~vector((vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
                     *)local_c0);
          p_Var3 = p_Var3->_M_nxt;
        } while (p_Var3 != (_Hash_node_base *)0x0);
      }
      local_c0._0_8_ = (pointer)(local_c0 + 0x10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_c0,local_120._0_8_,(pointer)(local_120._0_8_ + local_120._8_8_));
      local_a0._M_allocated_capacity = (size_type)local_90;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a0,local_100._M_p,local_100._M_p + sStack_f8);
      local_80 = local_e0;
      std::vector<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>::vector
                (&local_78,&local_d8);
      __l._M_len = 1;
      __l._M_array = (iterator)local_c0;
      std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::vector
                (__return_storage_ptr__,__l,&local_129);
      std::vector<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>::~vector
                (&local_78);
      if ((char *)local_a0._M_allocated_capacity != local_90) {
        operator_delete((void *)local_a0._M_allocated_capacity);
      }
      __mutex = local_128;
      if ((pointer)local_c0._0_8_ != (pointer)(local_c0 + 0x10)) {
        operator_delete((void *)local_c0._0_8_);
      }
      std::vector<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>::~vector
                (&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_p != &local_f0) {
        operator_delete(local_100._M_p);
      }
      if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
        operator_delete((void *)local_120._0_8_);
      }
    }
    pthread_mutex_unlock(__mutex);
    return __return_storage_ptr__;
  }
  uVar2 = std::__throw_system_error(iVar1);
  MetricFamily::~MetricFamily((MetricFamily *)local_c0);
  MetricFamily::~MetricFamily((MetricFamily *)local_120);
  pthread_mutex_unlock(local_128);
  _Unwind_Resume(uVar2);
}

Assistant:

std::vector<MetricFamily> Family<T>::Collect() const {
  std::lock_guard<std::mutex> lock{mutex_};

  if (metrics_.empty()) {
    return {};
  }

  auto family = MetricFamily{};
  family.name = name_;
  family.help = help_;
  family.type = T::metric_type;
  family.metric.reserve(metrics_.size());
  for (const auto& m : metrics_) {
    family.metric.push_back(std::move(CollectMetric(m.first, m.second.get())));
  }
  return {family};
}